

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

void __thiscall
cfd::ConfidentialTransactionContext::BlindTransactionWithDirectKey
          (ConfidentialTransactionContext *this,
          map<cfd::core::OutPoint,_cfd::core::UnblindParameter,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>_>
          *utxo_info_map,
          map<cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair>_>_>
          *issuance_key_map,
          vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
          *confidential_address_list,
          vector<cfd::ConfidentialKeyBlindParameter,_std::allocator<cfd::ConfidentialKeyBlindParameter>_>
          *confidential_key_list,int64_t minimum_range_value,int exponent,int minimum_bits,
          vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> *blinder_list)

{
  pointer pEVar1;
  pointer pCVar2;
  pointer pCVar3;
  bool bVar4;
  uint uVar5;
  _Base_ptr p_Var6;
  iterator iVar7;
  const_iterator __begin2;
  pointer pCVar8;
  pointer this_00;
  ulong uVar9;
  long local_2d0;
  long local_2c8;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> confidential_keys;
  vector<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
  issuance_blinding_keys;
  vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> txin_info_list;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>_>_>
  ct_map;
  string script;
  ByteData nonce;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1e0 [24];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1c8;
  Address local_1b0;
  
  txin_info_list.
  super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  txin_info_list.
  super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  txin_info_list.
  super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((utxo_info_map->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::resize
              (&txin_info_list,
               ((long)(this->super_ConfidentialTransaction).vin_.
                      super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->super_ConfidentialTransaction).vin_.
                     super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x160);
    for (p_Var6 = (utxo_info_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &(utxo_info_map->_M_t)._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      uVar5 = (*(this->super_ConfidentialTransaction).super_AbstractTransaction.
                _vptr_AbstractTransaction[0xf])(this,p_Var6 + 1);
      core::UnblindParameter::operator=
                (txin_info_list.
                 super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar5,
                 (UnblindParameter *)&p_Var6[2]._M_parent);
    }
  }
  issuance_blinding_keys.
  super__Vector_base<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  issuance_blinding_keys.
  super__Vector_base<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  issuance_blinding_keys.
  super__Vector_base<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((issuance_key_map->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::
    vector<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
    ::resize(&issuance_blinding_keys,
             ((long)(this->super_ConfidentialTransaction).vin_.
                    super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_ConfidentialTransaction).vin_.
                   super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x160);
    for (p_Var6 = (issuance_key_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &(issuance_key_map->_M_t)._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      uVar5 = (*(this->super_ConfidentialTransaction).super_AbstractTransaction.
                _vptr_AbstractTransaction[0xf])(this,p_Var6 + 1);
      core::IssuanceBlindingKeyPair::operator=
                (issuance_blinding_keys.
                 super__Vector_base<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar5,
                 (IssuanceBlindingKeyPair *)&p_Var6[2]._M_parent);
    }
  }
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&confidential_keys,
             ((long)(this->super_ConfidentialTransaction).vout_.
                    super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_ConfidentialTransaction).vout_.
                   super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0xf8,(allocator_type *)&local_1b0);
  ct_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &ct_map._M_t._M_impl.super__Rb_tree_header._M_header;
  ct_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ct_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  ct_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = (confidential_address_list->
            super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pEVar1 = (confidential_address_list->
           super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  ct_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       ct_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (this_00 != pEVar1) {
    for (; this_00 != pEVar1; this_00 = this_00 + 1) {
      core::ElementsConfidentialAddress::GetUnblindedAddress(&local_1b0,this_00);
      core::Address::GetLockingScript((Script *)&script,&local_1b0);
      core::Script::GetHex_abi_cxx11_((string *)&nonce,(Script *)&script);
      core::ElementsConfidentialAddress::GetConfidentialKey((ConfidentialKey *)&local_1c8,this_00);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Pubkey>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Pubkey>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Pubkey>>>
      ::_M_emplace_unique<std::__cxx11::string_const,cfd::core::Pubkey>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Pubkey>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Pubkey>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Pubkey>>>
                  *)&ct_map,(string *)&nonce,(Pubkey *)&local_1c8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1c8);
      std::__cxx11::string::~string((string *)&nonce);
      core::Script::~Script((Script *)&script);
      core::Address::~Address(&local_1b0);
    }
  }
  pCVar8 = (confidential_key_list->
           super__Vector_base<cfd::ConfidentialKeyBlindParameter,_std::allocator<cfd::ConfidentialKeyBlindParameter>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (confidential_key_list->
           super__Vector_base<cfd::ConfidentialKeyBlindParameter,_std::allocator<cfd::ConfidentialKeyBlindParameter>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pCVar8 != pCVar2) {
    for (; pCVar8 != pCVar2; pCVar8 = pCVar8 + 1) {
      if (pCVar8->index <
          (uint)(((long)(this->super_ConfidentialTransaction).vout_.
                        super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->super_ConfidentialTransaction).vout_.
                       super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0xf8)) {
        core::ByteData::operator=
                  (&confidential_keys.
                    super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                    _M_impl.super__Vector_impl_data._M_start[pCVar8->index].data_,
                   &(pCVar8->confidential_key).data_);
      }
    }
  }
  local_2c8 = 0xa0;
  local_2d0 = 0;
  for (uVar9 = 0;
      pCVar3 = (this->super_ConfidentialTransaction).vout_.
               super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar9 < (((long)(this->super_ConfidentialTransaction).vout_.
                      super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3) / 0xf8 &
              0xffffffffU); uVar9 = uVar9 + 1) {
    core::AbstractTxOut::GetLockingScript
              ((Script *)&local_1b0,(AbstractTxOut *)((long)pCVar3 + local_2c8 + -0xa0));
    core::Script::GetHex_abi_cxx11_(&script,(Script *)&local_1b0);
    core::Script::~Script((Script *)&local_1b0);
    bVar4 = core::Pubkey::IsValid
                      ((Pubkey *)
                       ((long)&((confidential_keys.
                                 super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->data_).data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + local_2d0));
    if (!bVar4) {
      iVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>_>_>
              ::find(&ct_map._M_t,&script);
      if ((_Rb_tree_header *)iVar7._M_node == &ct_map._M_t._M_impl.super__Rb_tree_header) {
        core::ConfidentialNonce::ConfidentialNonce
                  ((ConfidentialNonce *)&local_1b0,
                   (ConfidentialNonce *)
                   ((long)&(pCVar3->super_AbstractTxOut)._vptr_AbstractTxOut + local_2c8));
        core::ConfidentialNonce::GetData(&nonce,(ConfidentialNonce *)&local_1b0);
        core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)&local_1b0);
        bVar4 = core::Pubkey::IsValid(&nonce);
        if (bVar4) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    (local_1e0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&nonce);
          core::Pubkey::Pubkey((Pubkey *)&local_1b0,(ByteData *)local_1e0);
          core::ByteData::operator=
                    ((ByteData *)
                     ((long)&((confidential_keys.
                               super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>
                               ._M_impl.super__Vector_impl_data._M_start)->data_).data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start + local_2d0),
                     (ByteData *)&local_1b0);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1b0);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e0);
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&nonce);
      }
      else {
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>_>_>
                ::find(&ct_map._M_t,&script);
        core::ByteData::operator=
                  ((ByteData *)
                   ((long)&((confidential_keys.
                             super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>
                             ._M_impl.super__Vector_impl_data._M_start)->data_).data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start + local_2d0),
                   (ByteData *)(iVar7._M_node + 2));
      }
    }
    std::__cxx11::string::~string((string *)&script);
    local_2c8 = local_2c8 + 0xf8;
    local_2d0 = local_2d0 + 0x18;
  }
  core::ConfidentialTransaction::BlindTransaction
            (&this->super_ConfidentialTransaction,&txin_info_list,&issuance_blinding_keys,
             &confidential_keys,minimum_range_value,exponent,minimum_bits,blinder_list);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>_>_>
  ::~_Rb_tree(&ct_map._M_t);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&confidential_keys);
  std::
  vector<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>::
  ~vector(&issuance_blinding_keys);
  std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::~vector
            (&txin_info_list);
  return;
}

Assistant:

void ConfidentialTransactionContext::BlindTransactionWithDirectKey(
    const std::map<OutPoint, BlindParameter>& utxo_info_map,
    const std::map<OutPoint, IssuanceBlindingKeyPair>& issuance_key_map,
    const std::vector<ElementsConfidentialAddress>& confidential_address_list,
    const std::vector<ConfidentialKeyBlindParameter>& confidential_key_list,
    int64_t minimum_range_value, int exponent, int minimum_bits,
    std::vector<BlindData>* blinder_list) {
  uint32_t index = 0;
  std::vector<BlindParameter> txin_info_list;
  if (!utxo_info_map.empty()) {
    txin_info_list.resize(vin_.size());
    for (const auto& utxo_info : utxo_info_map) {
      index = GetTxInIndex(utxo_info.first);
      txin_info_list[index] = utxo_info.second;
    }
  }

  std::vector<IssuanceBlindingKeyPair> issuance_blinding_keys;
  if (!issuance_key_map.empty()) {
    issuance_blinding_keys.resize(vin_.size());
    for (const auto& key_info : issuance_key_map) {
      index = GetTxInIndex(key_info.first);
      issuance_blinding_keys[index] = key_info.second;
    }
  }

  std::vector<Pubkey> confidential_keys(vout_.size());
  std::map<std::string, Pubkey> ct_map;
  if (!confidential_address_list.empty()) {
    for (const auto& ct_addr : confidential_address_list) {
      ct_map.emplace(
          ct_addr.GetUnblindedAddress().GetLockingScript().GetHex(),
          ct_addr.GetConfidentialKey());
    }
  }
  if (!confidential_key_list.empty()) {
    for (const auto& data : confidential_key_list) {
      if (data.index < static_cast<uint32_t>(vout_.size())) {
        confidential_keys[data.index] = data.confidential_key;
      }
    }
  }
  for (index = 0; index < static_cast<uint32_t>(vout_.size()); ++index) {
    const auto& txout = vout_[index];
    std::string script = txout.GetLockingScript().GetHex();
    if (confidential_keys[index].IsValid()) {
      // do nothing
    } else if (ct_map.find(script) != std::end(ct_map)) {
      confidential_keys[index] = ct_map.find(script)->second;
    } else {
      ByteData nonce = txout.GetNonce().GetData();
      if (Pubkey::IsValid(nonce)) {
        confidential_keys[index] = Pubkey(nonce);
      }
    }
  }

  BlindTransaction(
      txin_info_list, issuance_blinding_keys, confidential_keys,
      minimum_range_value, exponent, minimum_bits, blinder_list);
}